

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

size_t lj_str_bufnum(char *s,cTValue *o)

{
  int iVar1;
  int *in_RSI;
  char *in_RDI;
  lua_Number n;
  size_t local_8;
  
  if ((uint)(in_RSI[1] << 1) < 0xffe00000) {
    iVar1 = sprintf(in_RDI,"%.14g",*(undefined8 *)in_RSI);
    local_8 = (size_t)iVar1;
  }
  else if ((in_RSI[1] & 0xfffffU) == 0 && *in_RSI == 0) {
    if ((in_RSI[1] & 0x80000000U) == 0) {
      *in_RDI = 'i';
      in_RDI[1] = 'n';
      in_RDI[2] = 'f';
      local_8 = 3;
    }
    else {
      builtin_strncpy(in_RDI,"-inf",4);
      local_8 = 4;
    }
  }
  else {
    *in_RDI = 'n';
    in_RDI[1] = 'a';
    in_RDI[2] = 'n';
    local_8 = 3;
  }
  return local_8;
}

Assistant:

size_t LJ_FASTCALL lj_str_bufnum(char *s, cTValue *o)
{
  if (LJ_LIKELY((o->u32.hi << 1) < 0xffe00000)) {  /* Finite? */
    lua_Number n = o->n;
#if __BIONIC__
    if (tvismzero(o)) { s[0] = '-'; s[1] = '0'; return 2; }
#endif
    return (size_t)lua_number2str(s, n);
  } else if (((o->u32.hi & 0x000fffff) | o->u32.lo) != 0) {
    s[0] = 'n'; s[1] = 'a'; s[2] = 'n'; return 3;
  } else if ((o->u32.hi & 0x80000000) == 0) {
    s[0] = 'i'; s[1] = 'n'; s[2] = 'f'; return 3;
  } else {
    s[0] = '-'; s[1] = 'i'; s[2] = 'n'; s[3] = 'f'; return 4;
  }
}